

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat_room.cpp
# Opt level: O1

PersonReference __thiscall ChatRoom::join(ChatRoom *this,string *name)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  long *plVar2;
  Person *this_00;
  long lVar3;
  pointer psVar4;
  pointer psVar5;
  string *cr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  long *plVar7;
  PersonReference PVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_88;
  string local_68;
  element_type *local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  string *local_38;
  
  plVar7 = (long *)(name->_M_dataplus)._M_p;
  plVar2 = (long *)name->_M_string_length;
  local_48 = (element_type *)this;
  local_40 = in_RDX;
  local_38 = name;
  if (plVar7 != plVar2) {
    do {
      this_00 = (Person *)*plVar7;
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"Room","");
      lVar3 = *(long *)*plVar7;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,lVar3,((long *)*plVar7)[1] + lVar3);
      std::__cxx11::string::append((char *)&local_68);
      Person::recieve(this_00,&local_88,&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      plVar7 = plVar7 + 2;
    } while (plVar7 != plVar2);
  }
  local_88._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Person,std::allocator<Person>,std::__cxx11::string&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_string_length,
             (Person **)&local_88,(allocator<Person> *)&local_68,local_40);
  cr = local_38;
  std::vector<std::shared_ptr<Person>,std::allocator<std::shared_ptr<Person>>>::
  emplace_back<std::shared_ptr<Person>>
            ((vector<std::shared_ptr<Person>,std::allocator<std::shared_ptr<Person>>> *)local_38,
             (shared_ptr<Person> *)&local_88);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
  }
  Person::set_hub(*(Person **)(cr->_M_string_length - 0x10),(ChatRoom *)cr);
  psVar4 = *(pointer *)(cr->_M_string_length - 0x10);
  psVar5 = *(pointer *)(cr->_M_string_length - 8);
  _Var6._M_pi = extraout_RDX;
  if (psVar5 != (pointer)0x0) {
    _Var6._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&__libc_single_threaded;
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(psVar5->super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var1 = &(psVar5->super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>)._M_refcount;
      *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
    }
  }
  (((_Vector_base<std::shared_ptr<Person>,_std::allocator<std::shared_ptr<Person>_>_> *)
   &(local_48->m_name)._M_dataplus)->_M_impl).super__Vector_impl_data._M_start = psVar4;
  (local_48->m_name)._M_string_length = (size_type)psVar5;
  PVar8.m_ptr.super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi
  ;
  PVar8.m_ptr.super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_48;
  return (PersonReference)PVar8.m_ptr.super___shared_ptr<Person,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ChatRoom::PersonReference ChatRoom::join(std::string name)
{
	for(auto& p : m_people)
	{
		p->recieve("Room", p->m_name + " has joined the chat...");
	}

	m_people.emplace_back(std::make_shared<Person>(name));
	m_people.back()->set_hub(*this);
	return m_people.back();
}